

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_str_insert_at_char(nk_str *s,int pos,char *str,int len)

{
  ulong uVar1;
  void *pvVar2;
  ulong size;
  uint uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x20cf,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)");
  }
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x20d0,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)");
  }
  if (len < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x20d1,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)");
  }
  iVar6 = 0;
  if (len != 0) {
    uVar1 = (s->buffer).allocated;
    if (((ulong)(long)pos <= uVar1) &&
       ((size = (ulong)(uint)len, uVar1 + size < (s->buffer).memory.size ||
        (iVar6 = 0, (s->buffer).type != NK_BUFFER_FIXED)))) {
      iVar6 = (int)uVar1 - pos;
      if (iVar6 == 0) {
        nk_str_append_text_char(s,str,len);
      }
      else {
        pvVar2 = nk_buffer_alloc(&s->buffer,NK_BUFFER_FRONT,size,0);
        if (pvVar2 == (void *)0x0) {
          return 0;
        }
        uVar3 = (pos + len + iVar6) - 1;
        if ((int)uVar3 < 0) {
          __assert_fail("((int)pos + (int)len + ((int)copylen - 1)) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                        ,0x20df,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)"
                       );
        }
        uVar5 = (int)uVar1 - 1;
        if ((int)uVar5 < 0) {
          __assert_fail("((int)pos + ((int)copylen - 1)) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                        ,0x20e0,"int nk_str_insert_at_char(struct nk_str *, int, const char *, int)"
                       );
        }
        pvVar2 = (s->buffer).memory.ptr;
        lVar4 = 0;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        for (; -iVar6 != (int)lVar4; lVar4 = lVar4 + -1) {
          *(undefined1 *)((long)pvVar2 + lVar4 + (ulong)uVar3) =
               *(undefined1 *)((long)pvVar2 + lVar4 + (ulong)uVar5);
        }
        nk_memcopy((void *)((long)pos + (long)(s->buffer).memory.ptr),str,size);
        iVar6 = nk_utf_len((char *)(s->buffer).memory.ptr,(int)(s->buffer).allocated);
        s->len = iVar6;
      }
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

NK_API int
nk_str_insert_at_char(struct nk_str *s, int pos, const char *str, int len)
{
    int i;
    void *mem;
    char *src;
    char *dst;

    int copylen;
    NK_ASSERT(s);
    NK_ASSERT(str);
    NK_ASSERT(len >= 0);
    if (!s || !str || !len || (nk_size)pos > s->buffer.allocated) return 0;
    if ((s->buffer.allocated + (nk_size)len >= s->buffer.memory.size) &&
        (s->buffer.type == NK_BUFFER_FIXED)) return 0;

    copylen = (int)s->buffer.allocated - pos;
    if (!copylen) {
        nk_str_append_text_char(s, str, len);
        return 1;
    }
    mem = nk_buffer_alloc(&s->buffer, NK_BUFFER_FRONT, (nk_size)len * sizeof(char), 0);
    if (!mem) return 0;

    /* memmove */
    NK_ASSERT(((int)pos + (int)len + ((int)copylen - 1)) >= 0);
    NK_ASSERT(((int)pos + ((int)copylen - 1)) >= 0);
    dst = nk_ptr_add(char, s->buffer.memory.ptr, pos + len + (copylen - 1));
    src = nk_ptr_add(char, s->buffer.memory.ptr, pos + (copylen-1));
    for (i = 0; i < copylen; ++i) *dst-- = *src--;
    mem = nk_ptr_add(void, s->buffer.memory.ptr, pos);
    NK_MEMCPY(mem, str, (nk_size)len * sizeof(char));
    s->len = nk_utf_len((char *)s->buffer.memory.ptr, (int)s->buffer.allocated);
    return 1;
}